

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void SobelXYRow_SSE2(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_argb,int width)

{
  bool bVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  int iVar8;
  long lVar9;
  undefined2 uVar10;
  undefined2 uVar17;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar35 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_sobely_local;
  uint8_t *src_sobelx_local;
  undefined4 uVar11;
  undefined6 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  undefined1 auVar16 [16];
  undefined4 uVar18;
  undefined6 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  lVar9 = (long)src_sobely - (long)src_sobelx;
  do {
    auVar16 = *(undefined1 (*) [16])src_sobelx;
    auVar23 = *(undefined1 (*) [16])((long)src_sobelx + lVar9);
    src_sobelx = (uint8_t *)((long)src_sobelx + 0x10);
    auVar24 = paddusb(auVar16,auVar23);
    auVar34._0_14_ = auVar16._0_14_;
    auVar34[0xe] = auVar16[7];
    auVar34[0xf] = 0xff;
    auVar33._14_2_ = auVar34._14_2_;
    auVar33._0_13_ = auVar16._0_13_;
    auVar33[0xd] = 0xff;
    auVar32._13_3_ = auVar33._13_3_;
    auVar32._0_12_ = auVar16._0_12_;
    auVar32[0xc] = auVar16[6];
    auVar31._12_4_ = auVar32._12_4_;
    auVar31._0_11_ = auVar16._0_11_;
    auVar31[0xb] = 0xff;
    auVar30._11_5_ = auVar31._11_5_;
    auVar30._0_10_ = auVar16._0_10_;
    auVar30[10] = auVar16[5];
    auVar29._10_6_ = auVar30._10_6_;
    auVar29._0_9_ = auVar16._0_9_;
    auVar29[9] = 0xff;
    auVar28._9_7_ = auVar29._9_7_;
    auVar28._0_8_ = auVar16._0_8_;
    auVar28[8] = auVar16[4];
    auVar27._8_8_ = auVar28._8_8_;
    auVar27._0_8_ = 0xff00000000000000;
    Var4 = CONCAT91(auVar27._7_9_,auVar16[3]);
    auVar26._6_10_ = Var4;
    auVar26._0_6_ = 0xff0000000000;
    auVar3._1_11_ = auVar26._5_11_;
    auVar3[0] = auVar16[2];
    auVar25._4_12_ = auVar3;
    auVar25._0_4_ = 0xff000000;
    auVar2._1_13_ = auVar25._3_13_;
    auVar2[0] = auVar16[1];
    auVar43[3] = 0xff;
    auVar43[2] = auVar16[0];
    uVar10 = CONCAT11(0xff,auVar16[8]);
    uVar11 = CONCAT13(0xff,CONCAT12(auVar16[9],uVar10));
    uVar12 = CONCAT15(0xff,CONCAT14(auVar16[10],uVar11));
    uVar13 = CONCAT17(0xff,CONCAT16(auVar16[0xb],uVar12));
    auVar14._0_10_ = CONCAT19(0xff,CONCAT18(auVar16[0xc],uVar13));
    auVar14[10] = auVar16[0xd];
    auVar14[0xb] = 0xff;
    auVar15[0xc] = auVar16[0xe];
    auVar15._0_12_ = auVar14;
    auVar15[0xd] = 0xff;
    auVar16[0xe] = auVar16[0xf];
    auVar16._0_14_ = auVar15;
    auVar16[0xf] = 0xff;
    auVar42._0_14_ = auVar23._0_14_;
    auVar42[0xe] = auVar23[7];
    auVar42[0xf] = auVar24[7];
    auVar41._14_2_ = auVar42._14_2_;
    auVar41._0_13_ = auVar23._0_13_;
    auVar41[0xd] = auVar24[6];
    auVar40._13_3_ = auVar41._13_3_;
    auVar40._0_12_ = auVar23._0_12_;
    auVar40[0xc] = auVar23[6];
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_11_ = auVar23._0_11_;
    auVar39[0xb] = auVar24[5];
    auVar38._11_5_ = auVar39._11_5_;
    auVar38._0_10_ = auVar23._0_10_;
    auVar38[10] = auVar23[5];
    auVar37._10_6_ = auVar38._10_6_;
    auVar37._0_9_ = auVar23._0_9_;
    auVar37[9] = auVar24[4];
    auVar36._9_7_ = auVar37._9_7_;
    auVar36._0_8_ = auVar23._0_8_;
    auVar36[8] = auVar23[4];
    Var7 = CONCAT91(CONCAT81(auVar36._8_8_,auVar24[3]),auVar23[3]);
    auVar6._2_10_ = Var7;
    auVar6[1] = auVar24[2];
    auVar6[0] = auVar23[2];
    auVar5._2_12_ = auVar6;
    auVar5[1] = auVar24[1];
    auVar5[0] = auVar23[1];
    auVar35._0_2_ = CONCAT11(auVar24[0],auVar23[0]);
    auVar35._2_14_ = auVar5;
    uVar17 = CONCAT11(auVar24[8],auVar23[8]);
    uVar18 = CONCAT13(auVar24[9],CONCAT12(auVar23[9],uVar17));
    uVar19 = CONCAT15(auVar24[10],CONCAT14(auVar23[10],uVar18));
    uVar20 = CONCAT17(auVar24[0xb],CONCAT16(auVar23[0xb],uVar19));
    auVar21._0_10_ = CONCAT19(auVar24[0xc],CONCAT18(auVar23[0xc],uVar20));
    auVar21[10] = auVar23[0xd];
    auVar21[0xb] = auVar24[0xd];
    auVar22[0xc] = auVar23[0xe];
    auVar22._0_12_ = auVar21;
    auVar22[0xd] = auVar24[0xe];
    auVar23[0xe] = auVar23[0xf];
    auVar23._0_14_ = auVar22;
    auVar23[0xf] = auVar24[0xf];
    auVar45._0_12_ = auVar35._0_12_;
    auVar45._12_2_ = (short)Var7;
    auVar45._14_2_ = (short)Var4;
    auVar44._12_4_ = auVar45._12_4_;
    auVar44._0_10_ = auVar35._0_10_;
    auVar44._10_2_ = auVar3._0_2_;
    auVar24._10_6_ = auVar44._10_6_;
    auVar24._0_8_ = auVar35._0_8_;
    auVar24._8_2_ = auVar6._0_2_;
    auVar43._8_8_ = auVar24._8_8_;
    auVar43._6_2_ = auVar2._0_2_;
    auVar43._4_2_ = auVar5._0_2_;
    auVar43._0_2_ = auVar35._0_2_;
    auVar51._12_2_ = (short)((ulong)uVar20 >> 0x30);
    auVar51._0_12_ = auVar21;
    auVar51._14_2_ = (short)((ulong)uVar13 >> 0x30);
    auVar50._12_4_ = auVar51._12_4_;
    auVar50._10_2_ = (short)((uint6)uVar12 >> 0x20);
    auVar50._0_10_ = auVar21._0_10_;
    auVar49._10_6_ = auVar50._10_6_;
    auVar49._8_2_ = (short)((uint6)uVar19 >> 0x20);
    auVar49._0_8_ = uVar20;
    auVar48._8_8_ = auVar49._8_8_;
    auVar48._6_2_ = (short)((uint)uVar11 >> 0x10);
    auVar48._0_6_ = uVar19;
    auVar47._6_10_ = auVar48._6_10_;
    auVar47._4_2_ = (short)((uint)uVar18 >> 0x10);
    auVar47._0_4_ = uVar18;
    auVar46._4_12_ = auVar47._4_12_;
    auVar46._2_2_ = uVar10;
    auVar46._0_2_ = uVar17;
    *(undefined1 (*) [16])dst_argb = auVar43;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = auVar36._8_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = auVar28._8_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = auVar38._10_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = auVar30._10_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = auVar40._12_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) = auVar32._12_2_;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = auVar41._14_2_;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = auVar33._14_2_;
    *(undefined1 (*) [16])((long)dst_argb + 0x20) = auVar46;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x30) =
         (short)((unkuint10)auVar21._0_10_ >> 0x40);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x30) + 2) =
         (short)((unkuint10)auVar14._0_10_ >> 0x40);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x30) + 4) = auVar21._10_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x30) + 6) = auVar14._10_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x30) + 8) = auVar22._12_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x30) + 10) = auVar15._12_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x30) + 0xc) = auVar23._14_2_;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x30) + 0xe) = auVar16._14_2_;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar8 = width + -0x10;
    bVar1 = 0xf < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar1);
  return;
}

Assistant:

void SobelXYRow_SSE2(const uint8_t* src_sobelx,
                     const uint8_t* src_sobely,
                     uint8_t* dst_argb,
                     int width) {
  asm volatile(
      "sub         %0,%1                         \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x00(%0,%1,1),%%xmm1          \n"
      "lea         0x10(%0),%0                   \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "paddusb     %%xmm1,%%xmm2                 \n"
      "movdqa      %%xmm0,%%xmm3                 \n"
      "punpcklbw   %%xmm5,%%xmm3                 \n"
      "punpckhbw   %%xmm5,%%xmm0                 \n"
      "movdqa      %%xmm1,%%xmm4                 \n"
      "punpcklbw   %%xmm2,%%xmm4                 \n"
      "punpckhbw   %%xmm2,%%xmm1                 \n"
      "movdqa      %%xmm4,%%xmm6                 \n"
      "punpcklwd   %%xmm3,%%xmm6                 \n"
      "punpckhwd   %%xmm3,%%xmm4                 \n"
      "movdqa      %%xmm1,%%xmm7                 \n"
      "punpcklwd   %%xmm0,%%xmm7                 \n"
      "punpckhwd   %%xmm0,%%xmm1                 \n"
      "movdqu      %%xmm6,(%2)                   \n"
      "movdqu      %%xmm4,0x10(%2)               \n"
      "movdqu      %%xmm7,0x20(%2)               \n"
      "movdqu      %%xmm1,0x30(%2)               \n"
      "lea         0x40(%2),%2                   \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_sobelx),  // %0
        "+r"(src_sobely),  // %1
        "+r"(dst_argb),    // %2
        "+r"(width)        // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}